

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_layout.cc
# Opt level: O3

void upb::generator::AddEnums
               (MessageDefPtr message,
               vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *enums,WhichEnums which)

{
  pointer pEVar1;
  pointer pEVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  upb_EnumDef *e;
  MessageDefPtr message_00;
  EnumDefPtr local_30;
  
  pEVar1 = (enums->super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pEVar2 = (enums->super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar4 = upb_MessageDef_NestedEnumCount(message.ptr_);
  std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::reserve
            (enums,(long)iVar4 + ((long)pEVar1 - (long)pEVar2 >> 3));
  iVar4 = upb_MessageDef_NestedEnumCount(message.ptr_);
  if (0 < iVar4) {
    iVar4 = 0;
    do {
      e = upb_MessageDef_NestedEnum(message.ptr_,iVar4);
      if (which == kAllEnums) {
LAB_0027a363:
        local_30.ptr_ = upb_MessageDef_NestedEnum(message.ptr_,iVar4);
        std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::
        emplace_back<upb::EnumDefPtr>(enums,&local_30);
      }
      else {
        _Var3 = upb_EnumDef_IsClosed(e);
        if (_Var3) goto LAB_0027a363;
      }
      iVar4 = iVar4 + 1;
      iVar5 = upb_MessageDef_NestedEnumCount(message.ptr_);
    } while (iVar4 < iVar5);
  }
  iVar4 = upb_MessageDef_NestedMessageCount(message.ptr_);
  if (0 < iVar4) {
    iVar4 = 0;
    do {
      message_00.ptr_ = upb_MessageDef_NestedMessage(message.ptr_,iVar4);
      AddEnums(message_00,enums,which);
      iVar4 = iVar4 + 1;
      iVar5 = upb_MessageDef_NestedMessageCount(message.ptr_);
    } while (iVar4 < iVar5);
  }
  return;
}

Assistant:

void AddEnums(upb::MessageDefPtr message, std::vector<upb::EnumDefPtr>* enums,
              WhichEnums which) {
  enums->reserve(enums->size() + message.enum_type_count());
  for (int i = 0; i < message.enum_type_count(); i++) {
    upb::EnumDefPtr enum_type = message.enum_type(i);
    if (which == kAllEnums || enum_type.is_closed()) {
      enums->push_back(message.enum_type(i));
    }
  }
  for (int i = 0; i < message.nested_message_count(); i++) {
    AddEnums(message.nested_message(i), enums, which);
  }
}